

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeRTASBuilderBuildExpPrologue
          (ZEParameterValidation *this,ze_rtas_builder_exp_handle_t hBuilder,
          ze_rtas_builder_build_op_exp_desc_t *pBuildOpDescriptor,void *pScratchBuffer,
          size_t scratchBufferSizeBytes,void *pRtasBuffer,size_t rtasBufferSizeBytes,
          ze_rtas_parallel_operation_exp_handle_t hParallelOperation,void *pBuildUserPtr,
          ze_rtas_aabb_exp_t *pBounds,size_t *pRtasBufferSizeBytes)

{
  ze_result_t zVar1;
  
  if (hBuilder != (ze_rtas_builder_exp_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((((pRtasBuffer != (void *)0x0 &&
           (pScratchBuffer != (void *)0x0 &&
           pBuildOpDescriptor != (ze_rtas_builder_build_op_exp_desc_t *)0x0)) &&
         (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION,
         pBuildOpDescriptor->rtasFormat != ZE_RTAS_FORMAT_EXP_FORCE_UINT32)) &&
        ((int)pBuildOpDescriptor->buildQuality < 3)) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, pBuildOpDescriptor->buildFlags < 4)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeRTASBuilderBuildExpPrologue(
        ze_rtas_builder_exp_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_exp_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        void* pScratchBuffer,                           ///< [in][range(0, `scratchBufferSizeBytes`)] scratch buffer to be used
                                                        ///< during acceleration structure construction
        size_t scratchBufferSizeBytes,                  ///< [in] size of scratch buffer, in bytes
        void* pRtasBuffer,                              ///< [in] pointer to destination buffer
        size_t rtasBufferSizeBytes,                     ///< [in] destination buffer size, in bytes
        ze_rtas_parallel_operation_exp_handle_t hParallelOperation, ///< [in][optional] handle to parallel operation object
        void* pBuildUserPtr,                            ///< [in][optional] pointer passed to callbacks
        ze_rtas_aabb_exp_t* pBounds,                    ///< [in,out][optional] pointer to destination address for acceleration
                                                        ///< structure bounds
        size_t* pRtasBufferSizeBytes                    ///< [out][optional] updated acceleration structure size requirement, in
                                                        ///< bytes
        )
    {
        if( nullptr == hBuilder )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pBuildOpDescriptor )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pScratchBuffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pRtasBuffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_RTAS_FORMAT_EXP_MAX < pBuildOpDescriptor->rtasFormat )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_RTAS_BUILDER_BUILD_QUALITY_HINT_EXP_HIGH < pBuildOpDescriptor->buildQuality )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0x3 < pBuildOpDescriptor->buildFlags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(pBuildOpDescriptor);
    }